

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O1

void test_to_neg<wchar_t>
               (string *source,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *target,
               string *encoding)

{
  string *psVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar3;
  char *pcVar4;
  int iVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  method_type mVar8;
  string *psVar9;
  char *pcVar10;
  bool bVar11;
  locale l;
  generator g;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_120;
  string local_100 [8];
  generator local_f8 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_f0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  booster::locale::generator::generator(local_f8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120,
                 "en_US.",encoding);
  booster::locale::generator::generate(local_100);
  paVar3 = &local_120.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  test_counter = test_counter + 1;
  pcVar10 = (source->_M_dataplus)._M_p;
  mVar8 = (method_type)encoding;
  booster::locale::conv::to_utf<wchar_t>
            ((char *)&local_120,pcVar10,(string *)(pcVar10 + source->_M_string_length),mVar8);
  if (local_120._M_string_length == target->_M_string_length) {
    if (local_120._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar5 = wmemcmp(local_120._M_dataplus._M_p,(target->_M_dataplus)._M_p,
                      local_120._M_string_length);
      bVar11 = iVar5 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xcf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," to_utf<Char>(source,encoding)==target",0x26);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar11) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_120._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_120);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar10 = (source->_M_dataplus)._M_p;
  psVar9 = (string *)(pcVar10 + -1);
  do {
    psVar1 = psVar9 + 1;
    psVar9 = psVar9 + 1;
  } while (*psVar1 != (string)0x0);
  booster::locale::conv::to_utf<wchar_t>((char *)&local_120,pcVar10,psVar9,mVar8);
  if (local_120._M_string_length == target->_M_string_length) {
    if (local_120._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar5 = wmemcmp(local_120._M_dataplus._M_p,(target->_M_dataplus)._M_p,
                      local_120._M_string_length);
      bVar11 = iVar5 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," to_utf<Char>(source.c_str(),encoding)==target",0x2e);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar11) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_120._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_120);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar10 = (source->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            ((char *)&local_120,pcVar10,(string *)(pcVar10 + source->_M_string_length),mVar8);
  if (local_120._M_string_length == target->_M_string_length) {
    if (local_120._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar5 = wmemcmp(local_120._M_dataplus._M_p,(target->_M_dataplus)._M_p,
                      local_120._M_string_length);
      bVar11 = iVar5 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target",
               0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar11) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_120._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_120);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar10 = (source->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            (&local_120,pcVar10,pcVar10 + source->_M_string_length,(locale *)local_100,
             default_method);
  if (local_120._M_string_length == target->_M_string_length) {
    if (local_120._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar5 = wmemcmp(local_120._M_dataplus._M_p,(target->_M_dataplus)._M_p,
                      local_120._M_string_length);
      bVar11 = iVar5 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," to_utf<Char>(source,l)==target",0x1f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar11) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_120._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_120);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar4 = (source->_M_dataplus)._M_p;
  pcVar10 = pcVar4 + -1;
  do {
    pcVar2 = pcVar10 + 1;
    pcVar10 = pcVar10 + 1;
  } while (*pcVar2 != '\0');
  booster::locale::conv::to_utf<wchar_t>
            (&local_120,pcVar4,pcVar10,(locale *)local_100,default_method);
  if (local_120._M_string_length == target->_M_string_length) {
    if (local_120._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar5 = wmemcmp(local_120._M_dataplus._M_p,(target->_M_dataplus)._M_p,
                      local_120._M_string_length);
      bVar11 = iVar5 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," to_utf<Char>(source.c_str(),l)==target",0x27);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar11) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_120._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_120);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar10 = (source->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            (&local_120,pcVar10,pcVar10 + source->_M_string_length,(locale *)local_100,
             default_method);
  if (local_120._M_string_length == target->_M_string_length) {
    if (local_120._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar5 = wmemcmp(local_120._M_dataplus._M_p,(target->_M_dataplus)._M_p,
                      local_120._M_string_length);
      bVar11 = iVar5 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," to_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target",0x44);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar11) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_120._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_120);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar10 = (source->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            ((char *)local_50,pcVar10,(string *)(pcVar10 + source->_M_string_length),mVar8);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6," to_utf<Char>(source,encoding,stop)",0x23);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_120._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar7,(string *)&local_120);
    __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  pcVar10 = (source->_M_dataplus)._M_p;
  psVar9 = (string *)(pcVar10 + -1);
  do {
    psVar1 = psVar9 + 1;
    psVar9 = psVar9 + 1;
  } while (*psVar1 != (string)0x0);
  error_counter = error_counter + 1;
  booster::locale::conv::to_utf<wchar_t>((char *)local_70,pcVar10,psVar9,mVar8);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6," to_utf<Char>(source.c_str(),encoding,stop)",0x2b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_120._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar7,(string *)&local_120);
    __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  pcVar10 = (source->_M_dataplus)._M_p;
  error_counter = error_counter + 1;
  booster::locale::conv::to_utf<wchar_t>
            ((char *)local_90,pcVar10,(string *)(pcVar10 + source->_M_string_length),mVar8);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6," to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding,stop)",0x48)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_120._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar7,(string *)&local_120);
    __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  pcVar10 = (source->_M_dataplus)._M_p;
  error_counter = error_counter + 1;
  booster::locale::conv::to_utf<wchar_t>
            (&local_b0,pcVar10,pcVar10 + source->_M_string_length,(locale *)local_100,stop);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," to_utf<Char>(source,l,stop)",0x1c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_120._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar7,(string *)&local_120);
    __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  pcVar4 = (source->_M_dataplus)._M_p;
  pcVar10 = pcVar4 + -1;
  do {
    pcVar2 = pcVar10 + 1;
    pcVar10 = pcVar10 + 1;
  } while (*pcVar2 != '\0');
  error_counter = error_counter + 1;
  booster::locale::conv::to_utf<wchar_t>(&local_d0,pcVar4,pcVar10,(locale *)local_100,stop);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xda);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6," to_utf<Char>(source.c_str(),l,stop)",0x24);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (error_counter < 0x15) {
    test_counter = test_counter + 1;
    pcVar10 = (source->_M_dataplus)._M_p;
    error_counter = error_counter + 1;
    booster::locale::conv::to_utf<wchar_t>
              (&local_f0,pcVar10,pcVar10 + source->_M_string_length,(locale *)local_100,stop);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xdb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," to_utf<Char>(source.c_str(),source.c_str()+source.size(),l,stop)",0x41);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (error_counter < 0x15) {
      error_counter = error_counter + 1;
      std::locale::~locale((locale *)local_100);
      booster::locale::generator::~generator(local_f8);
      return;
    }
    error_counter = error_counter + 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_120._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar7,(string *)&local_120);
    __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_120._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,"Error limits reached, stopping unit test","");
  booster::runtime_error::runtime_error(prVar7,(string *)&local_120);
  __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void test_to_neg(std::string source,std::basic_string<Char> target,std::string encoding)
{
    using namespace booster::locale::conv;
    booster::locale::generator g;
    std::locale l=g("en_US."+encoding);

    TEST(to_utf<Char>(source,encoding)==target);
    TEST(to_utf<Char>(source.c_str(),encoding)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target);
    TEST(to_utf<Char>(source,l)==target);
    TEST(to_utf<Char>(source.c_str(),l)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target);

    TESTF(to_utf<Char>(source,encoding,stop));
    TESTF(to_utf<Char>(source.c_str(),encoding,stop));
    TESTF(to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding,stop));
    TESTF(to_utf<Char>(source,l,stop));
    TESTF(to_utf<Char>(source.c_str(),l,stop));
    TESTF(to_utf<Char>(source.c_str(),source.c_str()+source.size(),l,stop));
}